

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O0

void __thiscall
Assimp::PlyExporter::PlyExporter(PlyExporter *this,char *_filename,aiScene *pScene,bool binary)

{
  aiMesh *this_00;
  aiScene *__s;
  bool bVar1;
  uint uVar2;
  aiReturn aVar3;
  ostream *poVar4;
  char *pcVar5;
  uint local_4ac;
  uint local_4a8;
  uint ofs;
  uint i_3;
  uint i_2;
  uint c_1;
  uint n_1;
  uint c;
  uint n;
  char *typeName;
  ai_real tmp;
  aiString s;
  aiMaterial *mat;
  uint local_70;
  uint i_1;
  uint t_1;
  uint t;
  aiMesh *m;
  uint i;
  uint components;
  uint vertices;
  uint faces;
  locale local_48 [8];
  locale *local_40;
  locale *l;
  allocator<char> local_22;
  byte local_21;
  aiScene *paStack_20;
  bool binary_local;
  aiScene *pScene_local;
  char *_filename_local;
  PlyExporter *this_local;
  
  local_21 = binary;
  paStack_20 = pScene;
  pScene_local = (aiScene *)_filename;
  _filename_local = (char *)this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  __s = pScene_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->filename,(char *)__s,&local_22);
  std::allocator<char>::~allocator(&local_22);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->endl,"\n",(allocator<char> *)((long)&l + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&l + 3));
  std::locale::locale(local_48,"C");
  local_40 = local_48;
  std::ios::imbue((locale *)&vertices);
  std::locale::~locale((locale *)&vertices);
  std::ios_base::precision((ios_base *)(&this->mOutput + *(long *)(*(long *)this + -0x18)),8);
  components = 0;
  i = 0;
  m._4_4_ = 0;
  for (m._0_4_ = 0; (uint)m < paStack_20->mNumMeshes; m._0_4_ = (uint)m + 1) {
    this_00 = paStack_20->mMeshes[(uint)m];
    components = components + this_00->mNumFaces;
    i = i + this_00->mNumVertices;
    bVar1 = aiMesh::HasNormals(this_00);
    if (bVar1) {
      m._4_4_ = m._4_4_ | 1;
    }
    bVar1 = aiMesh::HasTangentsAndBitangents(this_00);
    if (bVar1) {
      m._4_4_ = m._4_4_ | 2;
    }
    i_1 = 0;
    while (bVar1 = aiMesh::HasTextureCoords(this_00,i_1), bVar1) {
      m._4_4_ = 4 << ((byte)i_1 & 0x1f) | m._4_4_;
      i_1 = i_1 + 1;
    }
    local_70 = 0;
    while (bVar1 = aiMesh::HasVertexColors(this_00,local_70), bVar1) {
      m._4_4_ = 0x400 << ((byte)local_70 & 0x1f) | m._4_4_;
      local_70 = local_70 + 1;
    }
  }
  poVar4 = std::operator<<((ostream *)this,"ply");
  std::operator<<(poVar4,(string *)&this->endl);
  if ((local_21 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)this,"format ascii 1.0");
    std::operator<<(poVar4,(string *)&this->endl);
  }
  else {
    poVar4 = std::operator<<((ostream *)this,"format binary_little_endian 1.0");
    std::operator<<(poVar4,(string *)&this->endl);
  }
  poVar4 = std::operator<<((ostream *)this,
                           "comment Created by Open Asset Import Library - http://assimp.sf.net (v")
  ;
  uVar2 = aiGetVersionMajor();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<(poVar4,'.');
  uVar2 = aiGetVersionMinor();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<(poVar4,'.');
  uVar2 = aiGetVersionRevision();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<(poVar4,")");
  std::operator<<(poVar4,(string *)&this->endl);
  for (mat._4_4_ = 0; mat._4_4_ < paStack_20->mNumMaterials; mat._4_4_ = mat._4_4_ + 1) {
    s.data._1016_8_ = paStack_20->mMaterials[mat._4_4_];
    aiString::aiString((aiString *)((long)&typeName + 4));
    aVar3 = aiMaterial::Get((aiMaterial *)s.data._1016_8_,"$tex.file",1,0,
                            (aiString *)((long)&typeName + 4));
    if (aVar3 == aiReturn_SUCCESS) {
      poVar4 = std::operator<<((ostream *)this,"comment TextureFile ");
      poVar4 = std::operator<<(poVar4,(char *)&tmp);
      std::operator<<(poVar4,(string *)&this->endl);
    }
  }
  typeName._0_4_ = 0;
  pcVar5 = type_of<float>((float *)&typeName);
  poVar4 = std::operator<<((ostream *)this,"element vertex ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,i);
  std::operator<<(poVar4,(string *)&this->endl);
  poVar4 = std::operator<<((ostream *)this,"property ");
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4," x");
  std::operator<<(poVar4,(string *)&this->endl);
  poVar4 = std::operator<<((ostream *)this,"property ");
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4," y");
  std::operator<<(poVar4,(string *)&this->endl);
  poVar4 = std::operator<<((ostream *)this,"property ");
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4," z");
  std::operator<<(poVar4,(string *)&this->endl);
  if ((m._4_4_ & 1) != 0) {
    poVar4 = std::operator<<((ostream *)this,"property ");
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," nx");
    std::operator<<(poVar4,(string *)&this->endl);
    poVar4 = std::operator<<((ostream *)this,"property ");
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," ny");
    std::operator<<(poVar4,(string *)&this->endl);
    poVar4 = std::operator<<((ostream *)this,"property ");
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," nz");
    std::operator<<(poVar4,(string *)&this->endl);
  }
  c_1 = 0;
  for (n_1 = 4; (m._4_4_ & n_1) != 0 && c_1 != 8; n_1 = n_1 << 1) {
    if (c_1 == 0) {
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4," s");
      std::operator<<(poVar4,(string *)&this->endl);
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4," t");
      std::operator<<(poVar4,(string *)&this->endl);
    }
    else {
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4," s");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,c_1);
      std::operator<<(poVar4,(string *)&this->endl);
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4," t");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,c_1);
      std::operator<<(poVar4,(string *)&this->endl);
    }
    c_1 = c_1 + 1;
  }
  i_3 = 0;
  for (i_2 = 0x400; (m._4_4_ & i_2) != 0 && i_3 != 8; i_2 = i_2 << 1) {
    if (i_3 == 0) {
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,"uchar");
      poVar4 = std::operator<<(poVar4," red");
      std::operator<<(poVar4,(string *)&this->endl);
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,"uchar");
      poVar4 = std::operator<<(poVar4," green");
      std::operator<<(poVar4,(string *)&this->endl);
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,"uchar");
      poVar4 = std::operator<<(poVar4," blue");
      std::operator<<(poVar4,(string *)&this->endl);
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,"uchar");
      poVar4 = std::operator<<(poVar4," alpha");
      std::operator<<(poVar4,(string *)&this->endl);
    }
    else {
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,"uchar");
      poVar4 = std::operator<<(poVar4," red");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,i_3);
      std::operator<<(poVar4,(string *)&this->endl);
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,"uchar");
      poVar4 = std::operator<<(poVar4," green");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,i_3);
      std::operator<<(poVar4,(string *)&this->endl);
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,"uchar");
      poVar4 = std::operator<<(poVar4," blue");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,i_3);
      std::operator<<(poVar4,(string *)&this->endl);
      poVar4 = std::operator<<((ostream *)this,"property ");
      poVar4 = std::operator<<(poVar4,"uchar");
      poVar4 = std::operator<<(poVar4," alpha");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,i_3);
      std::operator<<(poVar4,(string *)&this->endl);
    }
    i_3 = i_3 + 1;
  }
  if ((m._4_4_ & 2) != 0) {
    poVar4 = std::operator<<((ostream *)this,"property ");
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," tx");
    std::operator<<(poVar4,(string *)&this->endl);
    poVar4 = std::operator<<((ostream *)this,"property ");
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," ty");
    std::operator<<(poVar4,(string *)&this->endl);
    poVar4 = std::operator<<((ostream *)this,"property ");
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," tz");
    std::operator<<(poVar4,(string *)&this->endl);
    poVar4 = std::operator<<((ostream *)this,"property ");
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," bx");
    std::operator<<(poVar4,(string *)&this->endl);
    poVar4 = std::operator<<((ostream *)this,"property ");
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," by");
    std::operator<<(poVar4,(string *)&this->endl);
    poVar4 = std::operator<<((ostream *)this,"property ");
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," bz");
    std::operator<<(poVar4,(string *)&this->endl);
  }
  poVar4 = std::operator<<((ostream *)this,"element face ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,components);
  std::operator<<(poVar4,(string *)&this->endl);
  poVar4 = std::operator<<((ostream *)this,"property list uchar int vertex_index");
  std::operator<<(poVar4,(string *)&this->endl);
  poVar4 = std::operator<<((ostream *)this,"end_header");
  std::operator<<(poVar4,(string *)&this->endl);
  for (ofs = 0; ofs < paStack_20->mNumMeshes; ofs = ofs + 1) {
    if ((local_21 & 1) == 0) {
      WriteMeshVerts(this,paStack_20->mMeshes[ofs],m._4_4_);
    }
    else {
      WriteMeshVertsBinary(this,paStack_20->mMeshes[ofs],m._4_4_);
    }
  }
  local_4ac = 0;
  for (local_4a8 = 0; local_4a8 < paStack_20->mNumMeshes; local_4a8 = local_4a8 + 1) {
    if ((local_21 & 1) == 0) {
      WriteMeshIndices(this,paStack_20->mMeshes[local_4a8],local_4ac);
    }
    else {
      WriteMeshIndicesBinary(this,paStack_20->mMeshes[local_4a8],local_4ac);
    }
    local_4ac = paStack_20->mMeshes[local_4a8]->mNumVertices + local_4ac;
  }
  std::locale::~locale(local_48);
  return;
}

Assistant:

PlyExporter::PlyExporter(const char* _filename, const aiScene* pScene, bool binary)
: filename(_filename)
, endl("\n")
{
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    const std::locale& l = std::locale("C");
    mOutput.imbue(l);
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    unsigned int faces = 0u, vertices = 0u, components = 0u;
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        const aiMesh& m = *pScene->mMeshes[i];
        faces += m.mNumFaces;
        vertices += m.mNumVertices;

        if (m.HasNormals()) {
            components |= PLY_EXPORT_HAS_NORMALS;
        }
        if (m.HasTangentsAndBitangents()) {
            components |= PLY_EXPORT_HAS_TANGENTS_BITANGENTS;
        }
        for (unsigned int t = 0; m.HasTextureCoords(t); ++t) {
            components |= PLY_EXPORT_HAS_TEXCOORDS << t;
        }
        for (unsigned int t = 0; m.HasVertexColors(t); ++t) {
            components |= PLY_EXPORT_HAS_COLORS << t;
        }
    }

    mOutput << "ply" << endl;
    if (binary) {
#if (defined AI_BUILD_BIG_ENDIAN)
        mOutput << "format binary_big_endian 1.0" << endl;
#else
        mOutput << "format binary_little_endian 1.0" << endl;
#endif
    }
    else {
        mOutput << "format ascii 1.0" << endl;
    }
    mOutput << "comment Created by Open Asset Import Library - http://assimp.sf.net (v"
        << aiGetVersionMajor() << '.' << aiGetVersionMinor() << '.'
        << aiGetVersionRevision() << ")" << endl;

    // Look through materials for a diffuse texture, and add it if found
    for ( unsigned int i = 0; i < pScene->mNumMaterials; ++i )
    {
        const aiMaterial* const mat = pScene->mMaterials[i];
        aiString s;
        if ( AI_SUCCESS == mat->Get( AI_MATKEY_TEXTURE_DIFFUSE( 0 ), s ) )
        {
            mOutput << "comment TextureFile " << s.data << endl;
        }
    }

    // TODO: probably want to check here rather than just assume something
    //       definitely not good to always write float even if we might have double precision

    ai_real tmp = 0.0;
    const char * typeName = type_of(tmp);

    mOutput << "element vertex " << vertices << endl;
    mOutput << "property " << typeName << " x" << endl;
    mOutput << "property " << typeName << " y" << endl;
    mOutput << "property " << typeName << " z" << endl;

    if(components & PLY_EXPORT_HAS_NORMALS) {
        mOutput << "property " << typeName << " nx" << endl;
        mOutput << "property " << typeName << " ny" << endl;
        mOutput << "property " << typeName << " nz" << endl;
    }

    // write texcoords first, just in case an importer does not support tangents
    // bitangents and just skips over the rest of the line upon encountering
    // unknown fields (Ply leaves pretty much every vertex component open,
    // but in reality most importers only know about vertex positions, normals
    // and texture coordinates).
    for (unsigned int n = PLY_EXPORT_HAS_TEXCOORDS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_TEXTURECOORDS; n <<= 1, ++c) {
        if (!c) {
            mOutput << "property " << typeName << " s" << endl;
            mOutput << "property " << typeName << " t" << endl;
        }
        else {
            mOutput << "property " << typeName << " s" << c << endl;
            mOutput << "property " << typeName << " t" << c << endl;
        }
    }

    for (unsigned int n = PLY_EXPORT_HAS_COLORS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_COLOR_SETS; n <<= 1, ++c) {
        if (!c) {
            mOutput << "property " << "uchar" << " red" << endl;
            mOutput << "property " << "uchar" << " green" << endl;
            mOutput << "property " << "uchar" << " blue" << endl;
            mOutput << "property " << "uchar" << " alpha" << endl;
        }
        else {
            mOutput << "property " << "uchar" << " red" << c << endl;
            mOutput << "property " << "uchar" << " green" << c << endl;
            mOutput << "property " << "uchar" << " blue" << c << endl;
            mOutput << "property " << "uchar" << " alpha" << c << endl;
        }
    }

    if(components & PLY_EXPORT_HAS_TANGENTS_BITANGENTS) {
        mOutput << "property " << typeName << " tx" << endl;
        mOutput << "property " << typeName << " ty" << endl;
        mOutput << "property " << typeName << " tz" << endl;
        mOutput << "property " << typeName << " bx" << endl;
        mOutput << "property " << typeName << " by" << endl;
        mOutput << "property " << typeName << " bz" << endl;
    }

    mOutput << "element face " << faces << endl;

    // uchar seems to be the most common type for the number of indices per polygon and int seems to be most common for the vertex indices.
    // For instance, MeshLab fails to load meshes in which both types are uint. Houdini seems to have problems as well.
    // Obviously, using uchar will not work for meshes with polygons with more than 255 indices, but how realistic is this case?
    mOutput << "property list uchar int vertex_index" << endl;

    mOutput << "end_header" << endl;

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        if (binary) {
            WriteMeshVertsBinary(pScene->mMeshes[i], components);
        }
        else {
            WriteMeshVerts(pScene->mMeshes[i], components);
        }
    }
    for (unsigned int i = 0, ofs = 0; i < pScene->mNumMeshes; ++i) {
        if (binary) {
            WriteMeshIndicesBinary(pScene->mMeshes[i], ofs);
        }
        else {
            WriteMeshIndices(pScene->mMeshes[i], ofs);
        }
        ofs += pScene->mMeshes[i]->mNumVertices;
    }
}